

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O3

Status __thiscall
sentencepiece::SentencePieceProcessor::NBestEncode
          (SentencePieceProcessor *this,string_view input,int nbest_size,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *pieces)

{
  void **ppvVar1;
  ostringstream *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  undefined4 in_register_0000000c;
  Status *_status;
  long lVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  long lVar5;
  long *plVar6;
  vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
  *in_R9;
  void **ppvVar7;
  long lVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  NBestSentencePieceText spt;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [24];
  int local_198;
  Rep *local_190;
  ios_base local_138 [264];
  
  plVar6 = (long *)input._M_len;
  (**(code **)(*plVar6 + 0x38))();
  if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
    util::Status::~Status((Status *)this);
    if (in_R9 == (vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  *)0x0) {
      this_00 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_4_ = 0xd;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"src/sentencepiece_processor.cc",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
      std::ostream::operator<<((ostream *)this_00,0x1b4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"pieces",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"output container is null",0x18);
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
    }
    else {
      pvVar2 = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 **)in_R9;
      pvVar3 = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 **)(in_R9 + 8);
      this_01 = pvVar2;
      if (pvVar3 != pvVar2) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_01);
          this_01 = this_01 + 1;
        } while (this_01 != pvVar3);
        *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          **)(in_R9 + 8) = pvVar2;
      }
      NBestSentencePieceText::NBestSentencePieceText
                ((NBestSentencePieceText *)local_1b0,(Arena *)0x0);
      (**(code **)(*plVar6 + 0xd0))
                (this,plVar6,input._M_str,CONCAT44(in_register_0000000c,nbest_size),
                 (ulong)pieces & 0xffffffff,(NBestSentencePieceText *)local_1b0);
      if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
        util::Status::~Status((Status *)this);
        ppvVar7 = local_190->elements;
        if (local_190 == (Rep *)0x0) {
          ppvVar7 = (void **)0x0;
        }
        if ((long)local_198 != 0) {
          ppvVar1 = ppvVar7 + local_198;
          do {
            local_1c8 = 0;
            uStack_1c0 = 0;
            local_1b8 = 0;
            lVar4 = *(long *)((long)*ppvVar7 + 0x40);
            lVar5 = lVar4 + 8;
            if (lVar4 == 0) {
              lVar5 = 0;
            }
            lVar4 = (long)*(int *)((long)*ppvVar7 + 0x38);
            if (lVar4 != 0) {
              lVar8 = 0;
              do {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string_const&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_1c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*(ulong *)(*(long *)(lVar5 + lVar8) + 0x30) & 0xfffffffffffffffe));
                lVar8 = lVar8 + 8;
              } while (lVar4 * 8 != lVar8);
            }
            std::
            vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                      (in_R9,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_1c8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1c8);
            ppvVar7 = ppvVar7 + 1;
          } while (ppvVar7 != ppvVar1);
        }
        util::Status::Status((Status *)this);
      }
      NBestSentencePieceText::~NBestSentencePieceText((NBestSentencePieceText *)local_1b0);
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::NBestEncode(
    absl::string_view input, int nbest_size,
    std::vector<std::vector<std::string>> *pieces) const {
  CHECK_OR_RETURN_STATUS_STL(pieces);

  NBestSentencePieceText spt;
  RETURN_IF_ERROR(NBestEncode(input, nbest_size, &spt));
  for (const auto &nbest : spt.nbests()) {
    std::vector<std::string> result;
    for (const auto &sp : nbest.pieces()) {
      result.emplace_back(sp.piece());
    }
    pieces->emplace_back(result);
  }

  return util::OkStatus();
}